

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O2

bool __thiscall
ON_CompressedBuffer::Write(ON_CompressedBuffer *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  bool bVar2;
  void *sz;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(binary_archive,0x40008000,1,0);
  if (!bVar1) {
    return false;
  }
  bVar1 = ON_BinaryArchive::WriteSize(binary_archive,this->m_sizeof_uncompressed);
  if (bVar1) {
    sz = this->m_buffer_compressed;
    if (sz != (void *)0x0) {
      sz = (void *)this->m_sizeof_compressed;
    }
    bVar1 = ON_BinaryArchive::WriteSize(binary_archive,(size_t)sz);
    if ((((bVar1) &&
         (bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->m_crc_uncompressed), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->m_crc_compressed), bVar1)) &&
       ((bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->m_method), bVar1 &&
        (bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->m_sizeof_element), bVar1)))) {
      bVar1 = true;
      if ((this->m_buffer_compressed != (void *)0x0) && (this->m_sizeof_compressed != 0)) {
        bVar1 = ON_BinaryArchive::WriteByte
                          (binary_archive,this->m_sizeof_compressed,this->m_buffer_compressed);
      }
      goto LAB_006872a7;
    }
  }
  bVar1 = false;
LAB_006872a7:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(binary_archive);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_CompressedBuffer::Write( ON_BinaryArchive& binary_archive ) const
{
  bool rc = binary_archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if ( !rc )
    return false;

  for(;;)
  {
#pragma ON_PRAGMA_WARNING_PUSH
#pragma ON_PRAGMA_WARNING_DISABLE_MSC(4996)
#pragma ON_PRAGMA_WARNING_DISABLE_CLANG("-Wdeprecated-declarations")
    rc = binary_archive.WriteSize(m_sizeof_uncompressed);
    if (!rc)
      break;
    rc = binary_archive.WriteSize((m_buffer_compressed && m_sizeof_compressed>0) ? m_sizeof_compressed : 0);
    if (!rc)
      break;
#pragma ON_PRAGMA_WARNING_POP
    rc = binary_archive.WriteInt(m_crc_uncompressed);
    if (!rc)
      break;
    rc = binary_archive.WriteInt(m_crc_compressed);
    if (!rc)
      break;
    rc = binary_archive.WriteInt(m_method);
    if (!rc)
      break;
    rc = binary_archive.WriteInt(m_sizeof_element);
    if (!rc)
      break;
    if ( m_buffer_compressed && m_sizeof_compressed > 0 )
    {
      rc = binary_archive.WriteByte(m_sizeof_compressed,m_buffer_compressed);
      if (!rc)
        break;
    }
    break;
  }

  if ( !binary_archive.EndWrite3dmChunk() )
    rc = false;

  return rc;
}